

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnv_hash.c
# Opt level: O3

uint32_t fnv1_hash_data(void *data,size_t size)

{
  byte *pbVar1;
  uint uVar2;
  size_t sVar3;
  uint8_t *bytes;
  
  uVar2 = 0x811c9dc5;
  if (size != 0) {
    sVar3 = 0;
    do {
      pbVar1 = (byte *)((long)data + sVar3);
      sVar3 = sVar3 + 1;
      uVar2 = (*pbVar1 ^ uVar2) * 0x1000193;
    } while (size != sVar3);
  }
  return uVar2;
}

Assistant:

uint32_t
fnv1_hash_data(const void *data, size_t size)
{
	uint32_t hash = 2166136261ul;
	const uint8_t *bytes = (uint8_t *)data;

	while (size-- != 0) {
		hash ^= *bytes;
		hash = hash * 0x01000193;
		bytes++;
	}

	return hash;
}